

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

bool __thiscall BackwardPass::ReverseCopyProp(BackwardPass *this,Instr *instr)

{
  OpCode OVar1;
  undefined2 valueType;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount> *pSVar2
  ;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  BOOLEAN BVar6;
  uint sourceContextId;
  uint functionId;
  BOOL BVar7;
  uint32 uVar8;
  BVIndex BVar9;
  BailOutKind BVar10;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  RegOpnd *pRVar11;
  RegOpnd *pRVar12;
  Instr *this_02;
  StackSym *this_03;
  BailOutInfo *pBVar13;
  BVSparse<Memory::JitArenaAllocator> *pBVar14;
  StackSym *pSVar15;
  Type *pTVar16;
  ByteCodeUsesInstr *pBVar17;
  Opnd *this_04;
  Type_conflict pBVar18;
  int iVar19;
  Iterator local_70;
  StackSym *local_60;
  undefined4 *local_58;
  RegOpnd *local_50;
  ByteCodeUsesInstr *local_48;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
  *local_40;
  RegOpnd *local_38;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,ReverseCopyPropPhase,sourceContextId,functionId);
  if (bVar4) {
    return false;
  }
  if (this->tag != DeadStorePhase) {
    return false;
  }
  if (this->currentPrePassLoop != (Loop *)0x0) {
    return false;
  }
  if (this->isCollectionPass != false) {
    return false;
  }
  BVar7 = Func::HasTry(this->func);
  if (BVar7 != 0) {
    return false;
  }
  if ((instr->m_opcode != Ld_I4) && (instr->m_opcode != Ld_A)) {
    return false;
  }
  OVar5 = IR::Opnd::GetKind(instr->m_dst);
  if (OVar5 != OpndKindReg) {
    return false;
  }
  OVar5 = IR::Opnd::GetKind(instr->m_src1);
  if (OVar5 != OpndKindReg) {
    return false;
  }
  if ((instr->field_0x38 & 0x10) != 0) {
    return false;
  }
  pRVar11 = IR::Opnd::AsRegOpnd(instr->m_dst);
  pRVar12 = IR::Opnd::AsRegOpnd(instr->m_src1);
  this_02 = IR::Instr::GetPrevRealInstrOrLabel(instr);
  this_03 = pRVar12->m_sym;
  local_50 = pRVar12;
  if ((this_03->field_0x1a & 1) != 0) {
    this_03 = StackSym::GetVarEquivSym(this_03,this->func);
  }
  this_04 = this_02->m_dst;
  local_38 = pRVar11;
  if (this_04 == (Opnd *)0x0) {
    if (this_02->m_opcode != ByteCodeUses) {
      return false;
    }
    local_48 = IR::Instr::AsByteCodeUsesInstr(this_02);
    pBVar14 = IR::ByteCodeUsesInstr::GetByteCodeUpwardExposedUsed(local_48);
    if (pBVar14 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      return false;
    }
    BVar6 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar14,(this_03->super_Sym).m_id);
    if (BVar6 == '\0') {
      return false;
    }
    pBVar18 = pBVar14->head;
    iVar19 = 0;
    if (pBVar18 == (Type_conflict)0x0) {
      return false;
    }
    do {
      BVar9 = BVUnitT<unsigned_long>::CountBit((pBVar18->data).word);
      pBVar17 = local_48;
      iVar19 = iVar19 + BVar9;
      pBVar18 = pBVar18->next;
    } while (pBVar18 != (Type)0x0);
    if (iVar19 != 1) {
      return false;
    }
    this_02 = IR::Instr::GetPrevRealInstrOrLabel(&local_48->super_Instr);
    this_04 = this_02->m_dst;
    if (this_04 == (Opnd *)0x0) {
      return false;
    }
  }
  else {
    pBVar17 = (ByteCodeUsesInstr *)0x0;
  }
  OVar1 = this_02->m_opcode;
  if (OVar1 == LdElemI_A) {
    return false;
  }
  if (OVar1 == IsInst) {
    return false;
  }
  if (OVar1 == ByteCodeUses) {
    return false;
  }
  local_48 = pBVar17;
  if ((this_02->field_0x38 & 0x10) != 0) {
    uVar8 = IR::Instr::GetByteCodeOffset(this_02);
    pBVar13 = IR::Instr::GetBailOutInfo(this_02);
    if (uVar8 != pBVar13->bailOutOffset) {
      return false;
    }
    this_04 = this_02->m_dst;
  }
  pRVar11 = local_50;
  bVar4 = IR::Opnd::IsEqual(this_04,&local_50->super_Opnd);
  if ((((bVar4) &&
       (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                          (this->currentBlock->upwardExposedUses,(pRVar11->m_sym->super_Sym).m_id),
       BVar6 == '\0')) &&
      ((pBVar14 = this->currentBlock->byteCodeUpwardExposedUsed,
       pBVar14 == (BVSparse<Memory::JitArenaAllocator> *)0x0 ||
       (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar14,(this_03->super_Sym).m_id),
       BVar6 == '\0')))) && (bVar4 = DoDeadStore(this->func,pRVar11->m_sym), bVar4)) {
    if ((((this_02->field_0x38 & 0x10) != 0) &&
        (local_60 = local_38->m_sym, local_60->m_type == TyInt32)) &&
       ((local_60->field_0x1a & 1) != 0)) {
      pSVar15 = IR::RegOpnd::TryGetStackSym(this_02->m_dst);
      BVar10 = IR::Instr::GetBailOutKind(this_02);
      if (((pSVar15 != (StackSym *)0x0) && ((BVar10 & BailOutOnResultConditions) != BailOutInvalid))
         && ((((pSVar15->m_type == TyInt32 &&
               (((pSVar15->field_0x1a & 1) != 0 && (this_02->m_src1 != (Opnd *)0x0)))) &&
              (bVar4 = IR::Opnd::IsEqual(this_02->m_dst,this_02->m_src1), !bVar4)) &&
             ((this_02->m_src2 == (Opnd *)0x0 ||
              (bVar4 = IR::Opnd::IsEqual(this_02->m_dst,this_02->m_src2), !bVar4)))))) {
        pBVar13 = IR::Instr::GetBailOutInfo(this_02);
        local_70.list = &pBVar13->usedCapturedValues->copyPropSyms;
        local_70.current = &(local_70.list)->super_SListNodeBase<Memory::ArenaAllocator>;
        local_40 = local_70.list;
        local_58 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        while( true ) {
          if (local_40 ==
              (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
               *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_58 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *local_58 = 0;
            local_40 = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                        *)local_70.current;
          }
          pSVar2 = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                    *)(local_40->super_SListNodeBase<Memory::ArenaAllocator>).next;
          if (pSVar2 == local_70.list) break;
          local_70.current = (NodeBase *)pSVar2;
          pTVar16 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data(&local_70);
          if (local_60 == pTVar16->value) {
            return false;
          }
          local_40 = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                      *)local_70.current;
        }
      }
    }
    if (local_48 == (ByteCodeUsesInstr *)0x0) {
      pRVar11 = IR::Opnd::AsRegOpnd(this_02->m_dst);
      if (((((pRVar11->super_Opnd).field_0xb & 8) != 0) &&
          (((local_50->super_Opnd).field_0xb & 8) == 0)) && ((this_03->field_0x19 & 0x20) != 0)) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this->currentBlock->byteCodeUpwardExposedUsed,(this_03->super_Sym).m_id);
      }
    }
    else {
      if (((this->currentBlock->byteCodeUpwardExposedUsed !=
            (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
          (pRVar11 = IR::Opnd::AsRegOpnd(this_02->m_dst), ((pRVar11->super_Opnd).field_0xb & 8) != 0
          )) && ((this_03->field_0x19 & 0x20) != 0)) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this->currentBlock->byteCodeUpwardExposedUsed,(this_03->super_Sym).m_id);
        bVar4 = IR::Opnd::IsEqual(&local_50->super_Opnd,&local_38->super_Opnd);
        if ((bVar4) && ((this_02->m_dst->field_0xb & 8) != 0)) {
          IR::Opnd::SetIsJITOptimizedReg(&local_38->super_Opnd,true);
        }
      }
      IR::Instr::Remove(&local_48->super_Instr);
    }
    if ((this->tag == DeadStorePhase) && (bVar4 = SatisfyMarkTempObjectsConditions(this), bVar4)) {
      ObjectTempVerify::NotifyReverseCopyProp
                (&this->currentBlock->tempObjectVerifyTracker->super_ObjectTempVerify,this_02);
    }
    pRVar11 = local_38;
    valueType = this_02->m_dst->m_valueType;
    IR::Opnd::SetValueType(&local_38->super_Opnd,(ValueType)valueType);
    IR::Instr::ReplaceDst(this_02,&pRVar11->super_Opnd);
    IR::Instr::Remove(instr);
    return true;
  }
  return false;
}

Assistant:

bool
BackwardPass::ReverseCopyProp(IR::Instr *instr)
{
    // Look for :
    //
    //  t1 = instr
    //       [bytecodeuse t1]
    //  t2 = Ld_A t1            >> t1 !upwardExposed
    //
    // Transform into:
    //
    //  t2 = instr
    //
    if (PHASE_OFF(Js::ReverseCopyPropPhase, this->func))
    {
        return false;
    }
    if (this->tag != Js::DeadStorePhase || this->IsPrePass() || this->IsCollectionPass())
    {
        return false;
    }
    if (this->func->HasTry())
    {
        // UpwardExposedUsed info can't be relied on
        return false;
    }

    // Find t2 = Ld_A t1
    switch (instr->m_opcode)
    {
    case Js::OpCode::Ld_A:
    case Js::OpCode::Ld_I4:
        break;

    default:
        return false;
    }

    if (!instr->GetDst()->IsRegOpnd())
    {
        return false;
    }
    if (!instr->GetSrc1()->IsRegOpnd())
    {
        return false;
    }
    if (instr->HasBailOutInfo())
    {
        return false;
    }

    IR::RegOpnd *dst = instr->GetDst()->AsRegOpnd();
    IR::RegOpnd *src = instr->GetSrc1()->AsRegOpnd();
    IR::Instr *instrPrev = instr->GetPrevRealInstrOrLabel();

    IR::ByteCodeUsesInstr *byteCodeUseInstr = nullptr;
    StackSym *varSym = src->m_sym;

    if (varSym->IsTypeSpec())
    {
        varSym = varSym->GetVarEquivSym(this->func);
    }

    // SKip ByteCodeUse instr if possible
    //       [bytecodeuse t1]
    if (!instrPrev->GetDst())
    {
        if (instrPrev->m_opcode == Js::OpCode::ByteCodeUses)
        {
            byteCodeUseInstr = instrPrev->AsByteCodeUsesInstr();
            const BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = byteCodeUseInstr->GetByteCodeUpwardExposedUsed();
            if (byteCodeUpwardExposedUsed && byteCodeUpwardExposedUsed->Test(varSym->m_id) && byteCodeUpwardExposedUsed->Count() == 1)
            {
                instrPrev = byteCodeUseInstr->GetPrevRealInstrOrLabel();

                if (!instrPrev->GetDst())
                {
                    return false;
                }
            }
            else
            {
                return false;
            }
        }
        else
        {
            return false;
        }
    }

    // The fast-path for these doesn't handle dst == src.
    // REVIEW: I believe the fast-path for LdElemI_A has been fixed... Nope, still broken for "i = A[i]" for prejit
    switch (instrPrev->m_opcode)
    {
    case Js::OpCode::LdElemI_A:
    case Js::OpCode::IsInst:
    case Js::OpCode::ByteCodeUses:
        return false;
    }

    // Can't do it if post-op bailout would need result
    // REVIEW: enable for pre-opt bailout?
    if (instrPrev->HasBailOutInfo() && instrPrev->GetByteCodeOffset() != instrPrev->GetBailOutInfo()->bailOutOffset)
    {
        return false;
    }

    // Make sure src of Ld_A == dst of instr
    //  t1 = instr
    if (!instrPrev->GetDst()->IsEqual(src))
    {
        return false;
    }

    // Make sure t1 isn't used later
    if (this->currentBlock->upwardExposedUses->Test(src->m_sym->m_id))
    {
        return false;
    }

    if (this->currentBlock->byteCodeUpwardExposedUsed && this->currentBlock->byteCodeUpwardExposedUsed->Test(varSym->m_id))
    {
        return false;
    }

    // Make sure we can dead-store this sym (debugger mode?)
    if (!this->DoDeadStore(this->func, src->m_sym))
    {
        return false;
    }

    StackSym *const dstSym = dst->m_sym;
    if(instrPrev->HasBailOutInfo() && dstSym->IsInt32() && dstSym->IsTypeSpec())
    {
        StackSym *const prevDstSym = IR::RegOpnd::TryGetStackSym(instrPrev->GetDst());
        if(instrPrev->GetBailOutKind() & IR::BailOutOnResultConditions &&
            prevDstSym &&
            prevDstSym->IsInt32() &&
            prevDstSym->IsTypeSpec() &&
            instrPrev->GetSrc1() &&
            !instrPrev->GetDst()->IsEqual(instrPrev->GetSrc1()) &&
            !(instrPrev->GetSrc2() && instrPrev->GetDst()->IsEqual(instrPrev->GetSrc2())))
        {
            // The previous instruction's dst value may be trashed by the time of the pre-op bailout. Skip reverse copy-prop if
            // it would replace the previous instruction's dst with a sym that bailout had decided to use to restore a value for
            // the pre-op bailout, which can't be trashed before bailout. See big comment in ProcessBailOutCopyProps for the
            // reasoning behind the tests above.
            FOREACH_SLISTBASE_ENTRY(
                CopyPropSyms,
                usedCopyPropSym,
                &instrPrev->GetBailOutInfo()->usedCapturedValues->copyPropSyms)
            {
                if(dstSym == usedCopyPropSym.Value())
                {
                    return false;
                }
            } NEXT_SLISTBASE_ENTRY;
        }
    }

    if (byteCodeUseInstr)
    {
        if (this->currentBlock->byteCodeUpwardExposedUsed && instrPrev->GetDst()->AsRegOpnd()->GetIsJITOptimizedReg() && varSym->HasByteCodeRegSlot())
        {
            if(varSym->HasByteCodeRegSlot())
            {
                this->currentBlock->byteCodeUpwardExposedUsed->Set(varSym->m_id);
            }

            if (src->IsEqual(dst) && instrPrev->GetDst()->GetIsJITOptimizedReg())
            {
                //      s2(s1).i32     =  FromVar        s1.var      #0000  Bailout: #0000 (BailOutIntOnly)
                //                        ByteCodeUses   s1
                //      s2(s1).i32     =  Ld_A           s2(s1).i32
                //
                // Since the dst on the FromVar is marked JITOptimized, we need to set it on the new dst as well,
                // or we'll change the bytecode liveness of s1

                dst->SetIsJITOptimizedReg(true);
            }
        }
        byteCodeUseInstr->Remove();
    }
    else if (instrPrev->GetDst()->AsRegOpnd()->GetIsJITOptimizedReg() && !src->GetIsJITOptimizedReg() && varSym->HasByteCodeRegSlot())
    {
        this->currentBlock->byteCodeUpwardExposedUsed->Set(varSym->m_id);
    }

#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        this->currentBlock->tempObjectVerifyTracker->NotifyReverseCopyProp(instrPrev);
    }
#endif

    dst->SetValueType(instrPrev->GetDst()->GetValueType());
    instrPrev->ReplaceDst(dst);

    instr->Remove();

    return true;
}